

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterEndAttribute(xmlTextWriterPtr writer)

{
  xmlLinkPtr lk_00;
  void *pvVar1;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    writer_local._4_4_ = -1;
  }
  else {
    lk_00 = xmlListFront(writer->nodes);
    if (lk_00 == (xmlLinkPtr)0x0) {
      writer_local._4_4_ = -1;
    }
    else {
      pvVar1 = xmlLinkGetData(lk_00);
      if (pvVar1 == (void *)0x0) {
        writer_local._4_4_ = -1;
      }
      else if (*(int *)((long)pvVar1 + 8) == 2) {
        *(undefined4 *)((long)pvVar1 + 8) = 1;
        writer_local._4_4_ = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
        if (writer_local._4_4_ < 0) {
          writer_local._4_4_ = -1;
        }
      }
      else {
        writer_local._4_4_ = -1;
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterEndAttribute(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0) {
        return -1;
    }

    sum = 0;
    switch (p->state) {
        case XML_TEXTWRITER_ATTRIBUTE:
            p->state = XML_TEXTWRITER_NAME;

            count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
            if (count < 0) {
                return -1;
            }
            sum += count;
            break;
        default:
            return -1;
    }

    return sum;
}